

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mode.cpp
# Opt level: O2

void __thiscall
duckdb::ModeState<double,_duckdb::ModeStandard<double>_>::ModeAdd
          (ModeState<double,_duckdb::ModeStandard<double>_> *this,idx_t row)

{
  ulong uVar1;
  size_t sVar2;
  double *__k;
  mapped_type *pmVar3;
  double *pdVar4;
  ulong uVar5;
  
  __k = GetCell(this,row);
  pmVar3 = std::__detail::
           _Map_base<double,_std::pair<const_double,_duckdb::ModeAttr>,_std::allocator<std::pair<const_double,_duckdb::ModeAttr>_>,_std::__detail::_Select1st,_std::equal_to<double>,_std::hash<double>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<double,_std::pair<const_double,_duckdb::ModeAttr>,_std::allocator<std::pair<const_double,_duckdb::ModeAttr>_>,_std::__detail::_Select1st,_std::equal_to<double>,_std::hash<double>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)this->frequency_map,__k);
  sVar2 = pmVar3->count;
  uVar1 = sVar2 + 1;
  pmVar3->count = uVar1;
  if (sVar2 == 0) {
    this->nonzero = this->nonzero + 1;
    pmVar3->first_row = row;
  }
  else {
    uVar5 = pmVar3->first_row;
    if (row < pmVar3->first_row) {
      uVar5 = row;
    }
    pmVar3->first_row = uVar5;
  }
  if (this->count < uVar1) {
    this->valid = true;
    this->count = uVar1;
    if (this->mode == (double *)0x0) {
      pdVar4 = (double *)operator_new(8);
      *pdVar4 = *__k;
      this->mode = pdVar4;
    }
    else {
      *this->mode = *__k;
    }
  }
  return;
}

Assistant:

void ModeAdd(idx_t row) {
		const auto &key = GetCell(row);
		auto &attr = (*frequency_map)[key];
		auto new_count = (attr.count += 1);
		if (new_count == 1) {
			++nonzero;
			attr.first_row = row;
		} else {
			attr.first_row = MinValue(row, attr.first_row);
		}
		if (new_count > count) {
			valid = true;
			count = new_count;
			if (mode) {
				*mode = key;
			} else {
				mode = new KEY_TYPE(key);
			}
		}
	}